

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionArgumentInfo
          (ValidationState_t *_,Instruction *inst)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  uint uVar4;
  Op OVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  DiagnosticStream DStack_1f8;
  
  psVar1 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar2 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  OVar5 = ValidationState_t::GetIdOpcode(_,uVar4);
  if (OVar5 == OpString) {
    uVar8 = (long)psVar1 - (long)psVar2 >> 4;
    if (5 < uVar8) {
      uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,5);
      OVar5 = ValidationState_t::GetIdOpcode(_,uVar4);
      if (OVar5 != OpString) {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar7 = "TypeName must be an OpString";
        lVar6 = 0x1c;
        goto LAB_001d2c3f;
      }
    }
    if (6 < uVar8) {
      uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,6);
      bVar3 = IsUint32Constant(_,uVar4);
      if (!bVar3) {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar7 = "AddressQualifier must be a 32-bit unsigned integer OpConstant";
        lVar6 = 0x3d;
        goto LAB_001d2c3f;
      }
    }
    if (7 < uVar8) {
      uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,7);
      bVar3 = IsUint32Constant(_,uVar4);
      if (!bVar3) {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar7 = "AccessQualifier must be a 32-bit unsigned integer OpConstant";
        lVar6 = 0x3c;
        goto LAB_001d2c3f;
      }
    }
    if (uVar8 < 9) {
      return SPV_SUCCESS;
    }
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,8);
    bVar3 = IsUint32Constant(_,uVar4);
    if (bVar3) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
    pcVar7 = "TypeQualifier must be a 32-bit unsigned integer OpConstant";
    lVar6 = 0x3a;
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
    pcVar7 = "Name must be an OpString";
    lVar6 = 0x18;
  }
LAB_001d2c3f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar7,lVar6);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateClspvReflectionArgumentInfo(ValidationState_t& _,
                                                 const Instruction* inst) {
  const auto num_operands = inst->operands().size();
  if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(4)) != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst) << "Name must be an OpString";
  }
  if (num_operands > 5) {
    if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(5)) != spv::Op::OpString) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "TypeName must be an OpString";
    }
  }
  if (num_operands > 6) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "AddressQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }
  if (num_operands > 7) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(7))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "AccessQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }
  if (num_operands > 8) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(8))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "TypeQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }

  return SPV_SUCCESS;
}